

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::solve_inequality
          (branch_and_bound_solver<baryonyx::itm::maximize_tag,_double> *this)

{
  pointer *ppnVar1;
  int iVar2;
  uint uVar3;
  pointer pnVar4;
  pointer pcVar5;
  undefined8 uVar6;
  bool bVar7;
  pointer piVar8;
  long lVar9;
  ptrdiff_t _Num;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  
  piVar8 = (this->items).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(this->items).
                super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::item>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)piVar8;
  this->lower_bound = -INFINITY;
  if (lVar9 == 0) {
    dVar11 = 0.0;
  }
  else {
    lVar9 = lVar9 >> 5;
    dVar11 = 0.0;
    do {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = piVar8->r;
      uVar6 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar12,1);
      bVar7 = (bool)((byte)uVar6 & 1);
      dVar11 = (double)((ulong)bVar7 * (long)(dVar11 + piVar8->r) + (ulong)!bVar7 * (long)dVar11);
      piVar8 = piVar8 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  this->upper_bound = dVar11;
  make_init_node_0(this);
  pnVar4 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = pnVar4[-1].sumfactor;
  if ((iVar2 < this->b_min) || (this->b_max < iVar2)) {
    if (this->b_max < iVar2) {
      uVar3 = pnVar4[-1].variables;
      shared_subvector::check_index(&this->subvector,uVar3);
      *(size_type *)
       ((this->subvector).m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
        _M_impl.super__Vector_impl_data._M_start + uVar3) = (this->subvector).m_free_list_head;
      (this->subvector).m_free_list_head = uVar3;
      ppnVar1 = &(this->nodes).
                 super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppnVar1 = *ppnVar1 + -1;
    }
  }
  else {
    this->upper_bound = pnVar4[-1].sumr;
    uVar10 = (ulong)(this->subvector).m_element_size;
    if (uVar10 != 0) {
      pcVar5 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar5 + this->solution,pcVar5 + pnVar4[-1].variables,uVar10);
    }
  }
  make_init_node_1(this);
  pnVar4 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = pnVar4[-1].sumfactor;
  if ((iVar2 < this->b_min) || (this->b_max < iVar2)) {
    if (this->b_max < iVar2) {
      uVar3 = pnVar4[-1].variables;
      shared_subvector::check_index(&this->subvector,uVar3);
      *(size_type *)
       ((this->subvector).m_container.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
        _M_impl.super__Vector_impl_data._M_start + uVar3) = (this->subvector).m_free_list_head;
      (this->subvector).m_free_list_head = uVar3;
      ppnVar1 = &(this->nodes).
                 super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppnVar1 = *ppnVar1 + -1;
    }
  }
  else {
    this->upper_bound = pnVar4[-1].sumr;
    uVar10 = (ulong)(this->subvector).m_element_size;
    if (uVar10 != 0) {
      pcVar5 = (this->subvector).m_container.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      memmove(pcVar5 + this->solution,pcVar5 + pnVar4[-1].variables,uVar10);
    }
  }
  while ((this->nodes).
         super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->nodes).
         super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::maximize_tag,_double>::node>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    make_next_inequality_node(this);
  }
  return;
}

Assistant:

void solve_inequality()
    {
        lower_bound = compute_lower_bound();
        upper_bound = compute_upper_bound();

        make_init_node_0();
        if (b_min <= nodes.back().sumfactor &&
            nodes.back().sumfactor <= b_max) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
        } else if (nodes.back().sumfactor > b_max) {
            subvector.remove(nodes.back().variables);
            nodes.pop_back(); // Remove the branch
        }

        make_init_node_1();
        if (b_min <= nodes.back().sumfactor &&
            nodes.back().sumfactor <= b_max) {
            upper_bound = nodes.back().sumr;
            subvector.copy(nodes.back().variables, solution);
        } else if (nodes.back().sumfactor > b_max) {
            subvector.remove(nodes.back().variables);
            nodes.pop_back(); // Remove the branch
        }

        while (!nodes.empty())
            make_next_inequality_node();
    }